

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_tracker.cpp
# Opt level: O1

void __thiscall
libtorrent::dht::dht_tracker::put_item
          (dht_tracker *this,public_key *key,function<void_(const_libtorrent::dht::item_&,_int)> *cb
          ,function<void_(libtorrent::dht::item_&)> *data_cb,string *salt)

{
  size_t sVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Base_ptr p_Var3;
  _Any_data local_d8;
  code *local_c8;
  code *pcStack_c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b8;
  _Rb_tree_node_base *local_b0;
  public_key *local_a8;
  string *local_a0;
  function<void_(libtorrent::dht::item_&)> *local_98;
  function<void_(const_libtorrent::dht::item_&,_int)> *local_90;
  code *local_88;
  _Any_data local_80;
  code *local_70;
  undefined8 uStack_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Any_data local_50;
  code *local_40;
  
  sVar1 = (this->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_a8 = key;
  local_a0 = salt;
  local_98 = data_cb;
  local_90 = cb;
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  this_00->_M_use_count = 1;
  this_00->_M_weak_count = 1;
  this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0046c1a8;
  *(int *)&this_00[1]._vptr__Sp_counted_base = (int)sVar1;
  *(undefined4 *)((long)&this_00[1]._vptr__Sp_counted_base + 4) = 0;
  p_Var3 = (this->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_b0 = &(this->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var3 != local_b0) {
    local_b8 = this_00 + 1;
    do {
      local_88 = anon_unknown_21::put_mutable_item_callback;
      std::function<void_(const_libtorrent::dht::item_&,_int)>::function
                ((function<void_(const_libtorrent::dht::item_&,_int)> *)&local_80,local_90);
      local_60 = local_b8;
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
      local_c8 = (code *)0x0;
      pcStack_c0 = (code *)0x0;
      local_d8._M_unused._M_object = (void *)0x0;
      local_d8._8_8_ = 0;
      local_58 = this_00;
      local_d8._M_unused._M_object = operator_new(0x38);
      p_Var2 = local_58;
      *(code **)local_d8._M_unused._0_8_ = local_88;
      *(undefined8 *)((long)local_d8._M_unused._0_8_ + 8) = 0;
      *(undefined8 *)((long)local_d8._M_unused._0_8_ + 0x10) = 0;
      *(undefined8 *)((long)local_d8._M_unused._0_8_ + 0x18) = 0;
      *(undefined8 *)((long)local_d8._M_unused._0_8_ + 0x20) = uStack_68;
      if (local_70 != (code *)0x0) {
        *(void **)((long)local_d8._M_unused._0_8_ + 8) = local_80._M_unused._M_object;
        *(undefined8 *)((long)local_d8._M_unused._0_8_ + 0x10) = local_80._8_8_;
        *(code **)((long)local_d8._M_unused._0_8_ + 0x18) = local_70;
        local_70 = (code *)0x0;
        uStack_68 = 0;
      }
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_d8._M_unused._0_8_ + 0x28) =
           local_60;
      *(undefined8 *)((long)local_d8._M_unused._0_8_ + 0x30) = 0;
      local_58 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_d8._M_unused._0_8_ + 0x30) =
           p_Var2;
      local_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      pcStack_c0 = std::
                   _Function_handler<void_(const_libtorrent::dht::item_&,_int),_std::_Bind<void_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,_std::function<void_(const_libtorrent::dht::item_&,_int)>))(const_libtorrent::dht::item_&,_int,_std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,_std::function<void_(const_libtorrent::dht::item_&,_int)>)>_>
                   ::_M_invoke;
      local_c8 = std::
                 _Function_handler<void_(const_libtorrent::dht::item_&,_int),_std::_Bind<void_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,_std::function<void_(const_libtorrent::dht::item_&,_int)>))(const_libtorrent::dht::item_&,_int,_std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,_std::function<void_(const_libtorrent::dht::item_&,_int)>)>_>
                 ::_M_manager;
      std::function<void_(libtorrent::dht::item_&)>::function
                ((function<void_(libtorrent::dht::item_&)> *)&local_50,local_98);
      node::put_item((node *)&p_Var3[1]._M_left,local_a8,local_a0,
                     (function<void_(const_libtorrent::dht::item_&,_int)> *)&local_d8,
                     (function<void_(libtorrent::dht::item_&)> *)&local_50);
      if (local_40 != (code *)0x0) {
        (*local_40)(&local_50,&local_50,__destroy_functor);
      }
      if (local_c8 != (code *)0x0) {
        (*local_c8)(&local_d8,&local_d8,__destroy_functor);
      }
      if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
      }
      if (local_70 != (code *)0x0) {
        (*local_70)(&local_80,&local_80,__destroy_functor);
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while (p_Var3 != local_b0);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  return;
}

Assistant:

void dht_tracker::put_item(public_key const& key
		, std::function<void(item const&, int)> cb
		, std::function<void(item&)> data_cb, std::string salt)
	{
		auto ctx = std::make_shared<put_item_ctx>(int(m_nodes.size()));
		for (auto& n : m_nodes)
			n.second.dht.put_item(key, salt, std::bind(&put_mutable_item_callback
				, _1, _2, ctx, cb), data_cb);
	}